

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteDot.c
# Opt level: O3

int Abc_NtkCountLogicNodes(Vec_Ptr_t *vNodes)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  
  if (0 < (long)vNodes->nSize) {
    lVar3 = 0;
    iVar2 = 0;
    do {
      pvVar1 = vNodes->pArray[lVar3];
      if (((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7) &&
         ((*(int *)((long)pvVar1 + 0x1c) != 0 || (*(int *)((long)pvVar1 + 0x2c) != 0)))) {
        iVar2 = iVar2 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (vNodes->nSize != lVar3);
    return iVar2;
  }
  return 0;
}

Assistant:

int Abc_NtkCountLogicNodes( Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( !Abc_ObjIsNode(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            continue;
        Counter ++;
    }
    return Counter;
}